

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int VmJsonObjectEncode(jx9_value *pKey,jx9_value *pValue,void *pUserData)

{
  sxu32 local_3c;
  char *pcStack_38;
  int nByte;
  char *zKey;
  json_private_data *pJson;
  void *pUserData_local;
  jx9_value *pValue_local;
  jx9_value *pKey_local;
  
  if (*(int *)((long)pUserData + 0x10) < 0x20) {
    zKey = (char *)pUserData;
    pJson = (json_private_data *)pUserData;
    pUserData_local = pValue;
    pValue_local = pKey;
    if (*(int *)((long)pUserData + 8) == 0) {
      SyBlobAppend(*pUserData,",",1);
    }
    pcStack_38 = jx9_value_to_string(pValue_local,(int *)&local_3c);
    if ((int)local_3c < 1) {
      SyBlobAppend(*(SyBlob **)zKey,"null",4);
    }
    else {
      SyBlobAppend(*(SyBlob **)zKey,"\"",1);
      SyBlobAppend(*(SyBlob **)zKey,pcStack_38,local_3c);
      SyBlobAppend(*(SyBlob **)zKey,"\"",1);
    }
    SyBlobAppend(*(SyBlob **)zKey,":",1);
    *(int *)(zKey + 0x10) = *(int *)(zKey + 0x10) + 1;
    VmJsonEncode((jx9_value *)pUserData_local,(json_private_data *)zKey);
    *(int *)(zKey + 0x10) = *(int *)(zKey + 0x10) + -1;
    zKey[8] = '\0';
    zKey[9] = '\0';
    zKey[10] = '\0';
    zKey[0xb] = '\0';
  }
  return 0;
}

Assistant:

static int VmJsonObjectEncode(jx9_value *pKey,jx9_value *pValue,void *pUserData)
{
	json_private_data *pJson = (json_private_data *)pUserData;
	const char *zKey;
	int nByte;
	if( pJson->nRecCount > 31 ){
		/* Recursion limit reached, return immediately */
		return JX9_OK;
	}
	if( !pJson->isFirst ){
		/* Append the colon first */
		SyBlobAppend(pJson->pOut,",",sizeof(char));
	}
	/* Extract a string representation of the key */
	zKey = jx9_value_to_string(pKey, &nByte);
	/* Append the key and the double colon */
	if( nByte > 0 ){
		SyBlobAppend(pJson->pOut,"\"",sizeof(char));
		SyBlobAppend(pJson->pOut,zKey,(sxu32)nByte);
		SyBlobAppend(pJson->pOut,"\"",sizeof(char));
	}else{
		/* Can't happen */
		SyBlobAppend(pJson->pOut,"null",sizeof("null")-1);
	}
	SyBlobAppend(pJson->pOut,":",sizeof(char));
	/* Encode the value */
	pJson->nRecCount++;
	VmJsonEncode(pValue, pJson);
	pJson->nRecCount--;
	pJson->isFirst = 0;
	return JX9_OK;
}